

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

MIR_reg_t get_fp_arg_reg(size_t fp_arg_num)

{
  size_t fp_arg_num_local;
  
  if (fp_arg_num < 8) {
    fp_arg_num_local._4_4_ = (int)fp_arg_num + 0x10;
  }
  else {
    fp_arg_num_local._4_4_ = 0xffffffff;
  }
  return fp_arg_num_local._4_4_;
}

Assistant:

static MIR_reg_t get_fp_arg_reg (size_t fp_arg_num) {
  switch (fp_arg_num) {
  case 0:
  case 1:
  case 2:
  case 3:
#ifndef _WIN32
  case 4:
  case 5:
  case 6:
  case 7:
#endif
    return (MIR_reg_t) (XMM0_HARD_REG + fp_arg_num);
  default: return MIR_NON_VAR;
  }
}